

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

int xmlNodeSetBase(xmlNodePtr cur,xmlChar *uri)

{
  xmlElementType xVar1;
  xmlChar *pxVar2;
  xmlAttrPtr pxVar3;
  xmlDocPtr doc;
  xmlChar *fixed;
  xmlNsPtr ns;
  xmlChar *uri_local;
  xmlNodePtr cur_local;
  
  if (cur == (xmlNodePtr)0x0) {
    cur_local._4_4_ = -1;
  }
  else {
    xVar1 = cur->type;
    ns = (xmlNsPtr)uri;
    uri_local = (xmlChar *)cur;
    if (xVar1 - XML_ELEMENT_NODE < 2) {
      xmlSearchNsByHrefSafe
                (cur,(xmlChar *)"http://www.w3.org/XML/1998/namespace",(xmlNsPtr *)&fixed);
      if (fixed == (xmlChar *)0x0) {
        cur_local._4_4_ = -1;
      }
      else {
        pxVar2 = xmlPathToURI((xmlChar *)ns);
        if (pxVar2 == (xmlChar *)0x0) {
          cur_local._4_4_ = -1;
        }
        else {
          pxVar3 = xmlSetNsProp((xmlNodePtr)uri_local,(xmlNsPtr)fixed,"base",pxVar2);
          if (pxVar3 == (xmlAttrPtr)0x0) {
            (*xmlFree)(pxVar2);
            cur_local._4_4_ = -1;
          }
          else {
            (*xmlFree)(pxVar2);
            cur_local._4_4_ = 0;
          }
        }
      }
    }
    else if ((xVar1 == XML_DOCUMENT_NODE) || (xVar1 == XML_HTML_DOCUMENT_NODE)) {
      if (cur[1].name != (xmlChar *)0x0) {
        (*xmlFree)(cur[1].name);
      }
      if (ns == (xmlNsPtr)0x0) {
        cur[1].name = (xmlChar *)0x0;
      }
      else {
        pxVar2 = xmlPathToURI((xmlChar *)ns);
        cur[1].name = pxVar2;
        if (cur[1].name == (xmlChar *)0x0) {
          return -1;
        }
      }
      cur_local._4_4_ = 0;
    }
    else {
      cur_local._4_4_ = -1;
    }
  }
  return cur_local._4_4_;
}

Assistant:

int
xmlNodeSetBase(xmlNodePtr cur, const xmlChar* uri) {
    xmlNsPtr ns;
    xmlChar* fixed;

    if (cur == NULL)
        return(-1);
    switch(cur->type) {
        case XML_ELEMENT_NODE:
        case XML_ATTRIBUTE_NODE:
	    break;
        case XML_DOCUMENT_NODE:
        case XML_HTML_DOCUMENT_NODE: {
	    xmlDocPtr doc = (xmlDocPtr) cur;

	    if (doc->URL != NULL)
		xmlFree((xmlChar *) doc->URL);
	    if (uri == NULL) {
		doc->URL = NULL;
            } else {
		doc->URL = xmlPathToURI(uri);
                if (doc->URL == NULL)
                    return(-1);
            }
	    return(0);
	}
        default:
	    return(-1);
    }

    xmlSearchNsByHrefSafe(cur, XML_XML_NAMESPACE, &ns);
    if (ns == NULL)
	return(-1);
    fixed = xmlPathToURI(uri);
    if (fixed == NULL)
        return(-1);
    if (xmlSetNsProp(cur, ns, BAD_CAST "base", fixed) == NULL) {
        xmlFree(fixed);
        return(-1);
    }
    xmlFree(fixed);

    return(0);
}